

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

Array2D<double> * __thiscall
pbrt::Array2D<double>::operator=(Array2D<double> *this,Array2D<double> *other)

{
  int iVar1;
  memory_resource *pmVar2;
  double *pdVar3;
  double *pdVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  int iVar8;
  undefined4 extraout_var;
  uint uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Bounds2<int> tmp;
  
  pmVar2 = (this->allocator).memoryResource;
  if (pmVar2 == (other->allocator).memoryResource) {
    TVar5 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    TVar6 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    TVar7 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
         (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar7;
    (other->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar5;
    (other->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar6;
    pdVar3 = this->values;
    this->values = other->values;
    other->values = pdVar3;
  }
  else {
    iVar8 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar1 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    if ((((other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x == iVar8) &&
        ((other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y == iVar1)) &&
       (auVar11._8_8_ = 0, auVar11._0_8_ = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>,
       auVar13._8_8_ = 0, auVar13._0_8_ = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>,
       uVar10 = vpcmpd_avx512vl(auVar11,auVar13,4), (uVar10 & 3) == 0)) {
      uVar9 = ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar1) *
              ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar8);
      if (0 < (int)uVar9) {
        pdVar3 = this->values;
        pdVar4 = other->values;
        uVar10 = 0;
        do {
          pdVar3[uVar10] = pdVar4[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      TVar5 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
           (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar5;
    }
    else {
      (*pmVar2->_vptr_memory_resource[3])
                (pmVar2,this->values,
                 (long)(((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar8) *
                       ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar1)) << 3,8);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      auVar13 = vpsubd_avx(auVar12,auVar14);
      auVar11 = vpshufd_avx(auVar13,0x55);
      auVar11 = vpmulld_avx(auVar11,auVar13);
      uVar9 = auVar11._0_4_;
      pmVar2 = (this->allocator).memoryResource;
      iVar8 = (*pmVar2->_vptr_memory_resource[2])(pmVar2,(long)(int)uVar9 * 8,8);
      this->values = (double *)CONCAT44(extraout_var,iVar8);
      if (0 < (int)uVar9) {
        pdVar3 = other->values;
        uVar10 = 0;
        do {
          ((double *)CONCAT44(extraout_var,iVar8))[uVar10] = pdVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
    }
  }
  return this;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }